

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall duckdb::RowGroup::NextVector(RowGroup *this,CollectionScanState *state)

{
  TableScanState *pTVar1;
  const_reference pvVar2;
  ColumnData *pCVar3;
  long lVar4;
  size_type __n;
  
  state->vector_index = state->vector_index + 1;
  pTVar1 = state->parent;
  if ((pTVar1->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
      .super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pTVar1->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
      .super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar4 = 0;
    __n = 0;
    do {
      pvVar2 = vector<duckdb::StorageIndex,_true>::operator[](&pTVar1->column_ids,__n);
      if (pvVar2->index != 0xffffffffffffffff) {
        pCVar3 = GetColumn(this,pvVar2->index);
        (*pCVar3->_vptr_ColumnData[0x10])
                  (pCVar3,(long)&((state->column_scans).
                                  super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                  .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                 _M_head_impl)->current + lVar4,0x800);
      }
      __n = __n + 1;
      lVar4 = lVar4 + 0x98;
    } while (__n < (ulong)((long)(pTVar1->column_ids).
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 .
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->column_ids).
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 .
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return;
}

Assistant:

void RowGroup::NextVector(CollectionScanState &state) {
	state.vector_index++;
	const auto &column_ids = state.GetColumnIds();
	for (idx_t i = 0; i < column_ids.size(); i++) {
		const auto &column = column_ids[i];
		if (column.IsRowIdColumn()) {
			continue;
		}
		GetColumn(column).Skip(state.column_scans[i]);
	}
}